

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O1

void __thiscall QScrollBar::QScrollBar(QScrollBar *this,Orientation orientation,QWidget *parent)

{
  QScrollBarPrivate *this_00;
  QAbstractSliderPrivate *this_01;
  
  this_01 = (QAbstractSliderPrivate *)operator_new(0x2c0);
  QAbstractSliderPrivate::QAbstractSliderPrivate(this_01);
  *(undefined ***)&this_01->super_QWidgetPrivate = &PTR__QScrollBarPrivate_00807440;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x14 = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x1c = 0xffffffffffffffff;
  *(undefined4 *)&this_01[1].super_QWidgetPrivate.field_0x28 = 0;
  QAbstractSlider::QAbstractSlider(&this->super_QAbstractSlider,this_01,parent);
  *(undefined ***)&(this->super_QAbstractSlider).super_QWidget = &PTR_metaObject_008071d8;
  *(undefined ***)&(this->super_QAbstractSlider).super_QWidget.super_QPaintDevice =
       &PTR__QScrollBar_00807398;
  this_00 = *(QScrollBarPrivate **)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  (this_00->super_QAbstractSliderPrivate).orientation = orientation;
  QScrollBarPrivate::init(this_00,(EVP_PKEY_CTX *)this_01);
  return;
}

Assistant:

QScrollBar::QScrollBar(Qt::Orientation orientation, QWidget *parent)
    : QAbstractSlider(*new QScrollBarPrivate, parent)
{
    d_func()->orientation = orientation;
    d_func()->init();
}